

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O1

void eltcalc::GetEventRates<occurrence>(occurrence *occ,FILE *fin)

{
  _Base_ptr p_Var1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  const_iterator __pos;
  _Base_ptr p_Var7;
  int iVar8;
  float *pfVar9;
  int no_of_periods;
  tuple<> tStack_41;
  _Head_base<0UL,_const_float_&,_false> a_Stack_40 [2];
  int local_2c;
  double local_28;
  
  local_2c = 0;
  a_Stack_40[0]._M_head_impl = (float *)0x103583;
  fread(&local_2c,4,1,(FILE *)fin);
  pfVar9 = (float *)0xc;
  a_Stack_40[0]._M_head_impl = (float *)0x103598;
  sVar5 = fread(occ,0xc,1,(FILE *)fin);
  if (sVar5 == 0) {
    iVar8 = 0;
  }
  else {
    local_28 = 1.0 / (double)local_2c;
    iVar8 = 0;
    do {
      a_Stack_40[0]._M_head_impl = (float *)0x1035c9;
      pmVar6 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,&occ->event_id);
      *pmVar6 = *pmVar6 + local_28;
      if (iVar8 <= occ->period_no) {
        iVar8 = occ->period_no;
      }
      pfVar9 = (float *)0xc;
      a_Stack_40[0]._M_head_impl = (float *)0x1035f5;
      sVar5 = fread(occ,0xc,1,(FILE *)fin);
    } while (sVar5 != 0);
  }
  a_Stack_40[0]._M_head_impl = (float *)0x103606;
  fclose((FILE *)fin);
  if (local_2c < iVar8) {
    a_Stack_40[0]._M_head_impl =
         (float *)std::
                  map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                  ::operator[];
    GetEventRates<occurrence>();
    p_Var7 = *(_Base_ptr *)
              ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
                *)fin + 0x10);
    p_Var1 = (_Base_ptr)
             ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
               *)fin + 8);
    __pos._M_node = p_Var1;
    if (p_Var7 != (_Base_ptr)0x0) {
      fVar2 = *pfVar9;
      do {
        bVar3 = fVar2 != (float)p_Var7[1]._M_color;
        bVar4 = (float)p_Var7[1]._M_color <= fVar2;
        if (!bVar4 || !bVar3) {
          __pos._M_node = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar4 && bVar3];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    if ((__pos._M_node == p_Var1) ||
       (*pfVar9 <= (float)__pos._M_node[1]._M_color && (float)__pos._M_node[1]._M_color != *pfVar9))
    {
      a_Stack_40[0]._M_head_impl = pfVar9;
      std::
      _Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
      ::
      _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<float_const&>,std::tuple<>>
                ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
                  *)fin,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<const_float_&> *)a_Stack_40,&tStack_41);
    }
    return;
  }
  return;
}

Assistant:

void GetEventRates(T &occ, FILE * fin)
	{
		// Calculate event rates from occurrence file
		int max_period_no = 0;
		int no_of_periods = 0;
		size_t i = fread(&no_of_periods, sizeof(no_of_periods), 1, fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_rate_[occ.event_id] += 1 / (double)no_of_periods;
			if (max_period_no < occ.period_no)
				max_period_no = occ.period_no;
			i = fread(&occ, sizeof(occ), 1, fin);
		}
		fclose(fin);

		if (max_period_no > no_of_periods) {
			fprintf(stderr, "FATAL: Maximum period number in occurrence file exceeds that in header.\n");
			exit(EXIT_FAILURE);
		}
	}